

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::R32UIImageSingleValueVerifier::operator()
          (R32UIImageSingleValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int param_3)

{
  bool bVar1;
  MessageBuilder *pMVar2;
  uint *puVar3;
  MessageBuilder local_5a0;
  MessageBuilder local_420;
  undefined1 local_2a0 [24];
  deUint32 resultValue;
  byte local_263;
  byte local_262;
  byte local_261;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  MessageBuilder local_1b0;
  int local_2c;
  ConstPixelBufferAccess *pCStack_28;
  int param_3_local;
  ConstPixelBufferAccess *resultSlice_local;
  TestLog *log_local;
  R32UIImageSingleValueVerifier *this_local;
  
  local_2c = param_3;
  pCStack_28 = resultSlice;
  resultSlice_local = (ConstPixelBufferAccess *)log;
  log_local = (TestLog *)this;
  tcu::TestLog::operator<<(&local_1b0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [33])"// Note: expecting to get value ");
  local_261 = 0;
  local_262 = 0;
  local_263 = 0;
  local_2a0[0x17] = 0;
  local_2a0[0x16] = 0;
  if (this->m_min == this->m_max) {
    de::toString<unsigned_int>(&local_1e0,&this->m_min);
  }
  else {
    de::toString<unsigned_int>(&local_260,&this->m_min);
    local_261 = 1;
    std::operator+(&local_240,"in range [",&local_260);
    local_262 = 1;
    std::operator+(&local_220,&local_240,", ");
    local_263 = 1;
    de::toString<unsigned_int>((string *)&resultValue,&this->m_max);
    local_2a0[0x17] = 1;
    std::operator+(&local_200,&local_220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultValue
                  );
    local_2a0[0x16] = 1;
    std::operator+(&local_1e0,&local_200,"]");
  }
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e0);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1e0);
  if ((local_2a0[0x16] & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_200);
  }
  if ((local_2a0[0x17] & 1) != 0) {
    std::__cxx11::string::~string((string *)&resultValue);
  }
  if ((local_263 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_220);
  }
  if ((local_262 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_240);
  }
  if ((local_261 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_260);
  }
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  tcu::ConstPixelBufferAccess::getPixelUint((ConstPixelBufferAccess *)local_2a0,(int)pCStack_28,0,0)
  ;
  puVar3 = tcu::Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_2a0);
  local_2a0._16_4_ = *puVar3;
  bVar1 = de::inRange<unsigned_int>(local_2a0._16_4_,this->m_min,this->m_max);
  if (bVar1) {
    tcu::TestLog::operator<<
              (&local_5a0,(TestLog *)resultSlice_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_5a0,(char (*) [23])"// Success: got value ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)(local_2a0 + 0x10));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5a0);
  }
  else {
    tcu::TestLog::operator<<
              (&local_420,(TestLog *)resultSlice_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_420,(char (*) [23])"// Failure: got value ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)(local_2a0 + 0x10));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_420);
  }
  return bVar1;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int) const
	{
		DE_ASSERT(resultSlice.getWidth() == 1 && resultSlice.getHeight() == 1 && resultSlice.getDepth() == 1);
		DE_ASSERT(resultSlice.getFormat() == TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32));

		log << TestLog::Message << "// Note: expecting to get value " << (m_min == m_max ? toString(m_min) : "in range [" + toString(m_min) + ", " + toString(m_max) + "]") << TestLog::EndMessage;

		const deUint32 resultValue = resultSlice.getPixelUint(0, 0).x();
		if (!de::inRange(resultValue, m_min, m_max))
		{
			log << TestLog::Message << "// Failure: got value " << resultValue << TestLog::EndMessage;
			return false;
		}
		else
		{
			log << TestLog::Message << "// Success: got value " << resultValue << TestLog::EndMessage;
			return true;
		}
	}